

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t strarray_get_count(strarray *array)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *__s;
  
  sVar3 = 0;
  pcVar1 = array->value;
  for (__s = pcVar1; (__s != (char *)0x0 && (__s < pcVar1 + array->length)); __s = __s + sVar2 + 1)
  {
    sVar3 = sVar3 + 1;
    sVar2 = strlen(__s);
  }
  return sVar3;
}

Assistant:

size_t
strarray_get_count(const struct strarray *array) {
  size_t count = 0;
  char *ptr;

  strarray_for_each_element(array, ptr) {
    count++;
  }
  return count;
}